

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::AtomicCounterBufferStorageTestCase::initTestCaseGlobal
          (AtomicCounterBufferStorageTestCase *this)

{
  GLint *pGVar1;
  uint uVar2;
  GLenum GVar3;
  GLuint GVar4;
  ostream *poVar5;
  uint uVar6;
  bool bVar7;
  GLuint ac_uniform_index;
  string n_counters_string;
  char *vs_body_parts [3];
  long *local_1d0 [2];
  long local_1c0 [2];
  stringstream n_counters_sstream;
  undefined1 local_1a0 [376];
  
  ac_uniform_index = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&n_counters_sstream);
  n_counters_string._M_string_length = 0;
  n_counters_string.field_2._M_local_buf[0] = '\0';
  vs_body_parts[0] = "#version 430 core\n\n";
  vs_body_parts[1] = (char *)0x0;
  vs_body_parts[2] =
       "layout(binding = 0) uniform atomic_uint counters[N_COUNTERS];\n\nvoid main()\n{\n    for (uint n = 0; n < N_COUNTERS; ++n)\n    {\n        if (n == gl_VertexID)\n        {\n            atomicCounterIncrement(counters[n]);\n        }\n    }\n\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n}\n"
  ;
  pGVar1 = &this->m_gl_max_vertex_atomic_counters_value;
  n_counters_string._M_dataplus._M_p = (pointer)&n_counters_string.field_2;
  (*this->m_gl->getIntegerv)(0x92d2,pGVar1);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"glGetIntegerv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x419);
  bVar7 = true;
  if (*pGVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"#define N_COUNTERS ",0x13);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,*pGVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&n_counters_string,(string *)local_1d0);
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0],local_1c0[0] + 1);
    }
    vs_body_parts[1] = n_counters_string._M_dataplus._M_p;
    GVar4 = SparseBufferTestUtilities::createProgram
                      (this->m_gl,(char **)0x0,0,vs_body_parts,3,(char **)0x0,(uint *)0x0,0,
                       (GLchar **)0x0,0,0);
    this->m_po = GVar4;
    if (GVar4 == 0) {
      bVar7 = false;
    }
    else {
      (*this->m_gl->getActiveUniformsiv)
                (GVar4,1,&ac_uniform_index,0x8a3c,&this->m_gl_atomic_counter_uniform_array_stride);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glGetActiveUniformsiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x440);
      uVar6 = this->m_gl_max_vertex_atomic_counters_value *
              this->m_gl_atomic_counter_uniform_array_stride;
      this->m_helper_bo_size = uVar6;
      uVar2 = this->m_page_size;
      this->m_helper_bo_size_rounded = (uVar2 - uVar6 % uVar2) % uVar2 + uVar6;
      (*this->m_gl->genBuffers)(1,&this->m_helper_bo);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,1099);
      (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x44e);
      (*this->m_gl->bufferStorage)(0x8f36,(ulong)this->m_helper_bo_size,(void *)0x0,1);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBufferStorage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x451);
      (*this->m_gl->genVertexArrays)(1,&this->m_vao);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glGenVertexArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x457);
      (*this->m_gl->bindVertexArray)(this->m_vao);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBindVertexArray() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x45a);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)n_counters_string._M_dataplus._M_p != &n_counters_string.field_2) {
    operator_delete(n_counters_string._M_dataplus._M_p,
                    CONCAT71(n_counters_string.field_2._M_allocated_capacity._1_7_,
                             n_counters_string.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&n_counters_sstream);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return bVar7;
}

Assistant:

bool AtomicCounterBufferStorageTestCase::initTestCaseGlobal()
{
	const glw::GLuint ac_uniform_index = 0; /* only one uniform is defined in the VS below */
	std::stringstream n_counters_sstream;
	std::string		  n_counters_string;
	bool			  result = true;

	static const char* vs_body_preamble = "#version 430 core\n"
										  "\n";

	static const char* vs_body_core = "layout(binding = 0) uniform atomic_uint counters[N_COUNTERS];\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    for (uint n = 0; n < N_COUNTERS; ++n)\n"
									  "    {\n"
									  "        if (n == gl_VertexID)\n"
									  "        {\n"
									  "            atomicCounterIncrement(counters[n]);\n"
									  "        }\n"
									  "    }\n"
									  "\n"
									  "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
									  "}\n";
	const char* vs_body_parts[] = { vs_body_preamble, DE_NULL, /* will be set to n_counters_string.c_str() */
									vs_body_core };
	const unsigned int n_vs_body_parts = sizeof(vs_body_parts) / sizeof(vs_body_parts[0]);

	/* Retrieve GL_MAX_VERTEX_ATOMIC_COUNTERS value. The test will only be executed if it's >= 1 */
	m_gl.getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &m_gl_max_vertex_atomic_counters_value);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetIntegerv() call failed.");

	if (m_gl_max_vertex_atomic_counters_value == 0)
	{
		goto end;
	}

	/* Form the N_COUNTERS declaration string */
	n_counters_sstream << "#define N_COUNTERS " << m_gl_max_vertex_atomic_counters_value << "\n";
	n_counters_string = n_counters_sstream.str();

	vs_body_parts[1] = n_counters_string.c_str();

	/* Set up the program object */
	DE_ASSERT(m_po == 0);

	m_po =
		SparseBufferTestUtilities::createProgram(m_gl, DE_NULL,							  /* fs_body_parts   */
												 0,										  /* n_fs_body_parts */
												 vs_body_parts, n_vs_body_parts, DE_NULL, /* attribute_names        */
												 DE_NULL,								  /* attribute_locations    */
												 0);									  /* n_attribute_properties */

	if (m_po == 0)
	{
		result = false;

		goto end;
	}

	/* Helper BO will be used to hold the atomic counter buffer data.
	 * Determine how much space will be needed.
	 *
	 * Min max for the GL constant value is 0. Bail out if that's the
	 * value we are returned - it is pointless to execute the test in
	 * such environment.
	 */
	m_gl.getActiveUniformsiv(m_po, 1, /* uniformCount */
							 &ac_uniform_index, GL_UNIFORM_ARRAY_STRIDE, &m_gl_atomic_counter_uniform_array_stride);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetActiveUniformsiv() call failed.");

	DE_ASSERT(m_gl_atomic_counter_uniform_array_stride >= (int)sizeof(unsigned int));

	m_helper_bo_size		 = m_gl_atomic_counter_uniform_array_stride * m_gl_max_vertex_atomic_counters_value;
	m_helper_bo_size_rounded = SparseBufferTestUtilities::alignOffset(m_helper_bo_size, m_page_size);

	/* Set up the helper BO */
	DE_ASSERT(m_helper_bo == 0);

	m_gl.genBuffers(1, &m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferStorage(GL_COPY_READ_BUFFER, m_helper_bo_size, DE_NULL, GL_MAP_READ_BIT); /* flags */
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferStorage() call failed.");

	/* Set up the vertex array object */
	DE_ASSERT(m_vao == 0);

	m_gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenVertexArrays() call failed.");

	m_gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindVertexArray() call failed.");

end:
	return result;
}